

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O2

int ffgcv(fitsfile *fptr,int datatype,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem
         ,void *nulval,void *array,int *anynul,int *status)

{
  float nulval_00;
  double nulval_01;
  char cVar1;
  uchar nulval_02;
  short nulval_03;
  unsigned_short nulval_04;
  int nulval_05;
  uint nulval_06;
  unsigned_long nulval_07;
  LONGLONG nulval_08;
  ULONGLONG nulval_09;
  long nulval_10;
  char cdummy [2];
  
  if (0 < *status) {
    return *status;
  }
  switch(datatype) {
  case 0xb:
    if (nulval == (void *)0x0) {
      nulval_02 = '\0';
    }
    else {
      nulval_02 = *nulval;
    }
    ffgclb(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_02,(uchar *)array,cdummy,anynul,status);
    break;
  case 0xc:
    if (nulval == (void *)0x0) {
      cVar1 = '\0';
    }
    else {
      cVar1 = *nulval;
    }
    ffgclsb(fptr,colnum,firstrow,firstelem,nelem,1,1,cVar1,(char *)array,cdummy,anynul,status);
    break;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_0013d20f_caseD_d:
    *status = 0x19a;
    break;
  case 0xe:
    if (nulval == (void *)0x0) {
      cVar1 = '\0';
    }
    else {
      cVar1 = *nulval;
    }
    ffgcll(fptr,colnum,firstrow,firstelem,nelem,1,cVar1,(char *)array,cdummy,anynul,status);
    break;
  case 0x10:
    if (nulval == (void *)0x0) {
      nulval = cdummy;
      cdummy[0] = '\0';
    }
    ffgcls(fptr,colnum,firstrow,firstelem,nelem,1,(char *)nulval,(char **)array,cdummy,anynul,status
          );
    break;
  case 0x14:
    if (nulval == (void *)0x0) {
      nulval_04 = 0;
    }
    else {
      nulval_04 = *nulval;
    }
    ffgclui(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_04,(unsigned_short *)array,cdummy,anynul
            ,status);
    break;
  case 0x15:
    if (nulval == (void *)0x0) {
      nulval_03 = 0;
    }
    else {
      nulval_03 = *nulval;
    }
    ffgcli(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_03,(short *)array,cdummy,anynul,status);
    break;
  default:
    switch(datatype) {
    case 0x50:
      if (nulval == (void *)0x0) {
        nulval_09 = 0;
      }
      else {
        nulval_09 = *nulval;
      }
      ffgclujj(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_09,(ULONGLONG *)array,cdummy,anynul,
               status);
      break;
    case 0x51:
      if (nulval == (void *)0x0) {
        nulval_08 = 0;
      }
      else {
        nulval_08 = *nulval;
      }
      ffgcljj(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_08,(LONGLONG *)array,cdummy,anynul,
              status);
      break;
    case 0x53:
      nelem = nelem * 2;
      firstelem = firstelem * 2 + -1;
LAB_0013d3ea:
      if (nulval == (void *)0x0) {
        nulval_00 = 0.0;
      }
      else {
        nulval_00 = *nulval;
      }
      ffgcle(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_00,(float *)array,cdummy,anynul,status)
      ;
      break;
    default:
      if (datatype != 0xa3) {
        if (datatype == 0x1e) {
          if (nulval == (void *)0x0) {
            nulval_06 = 0;
          }
          else {
            nulval_06 = *nulval;
          }
          ffgcluk(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_06,(uint *)array,cdummy,anynul,
                  status);
          break;
        }
        if (datatype == 0x1f) {
          if (nulval == (void *)0x0) {
            nulval_05 = 0;
          }
          else {
            nulval_05 = *nulval;
          }
          ffgclk(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_05,(int *)array,cdummy,anynul,
                 status);
          break;
        }
        if (datatype == 0x28) {
          if (nulval == (void *)0x0) {
            nulval_07 = 0;
          }
          else {
            nulval_07 = *nulval;
          }
          ffgcluj(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_07,(unsigned_long *)array,cdummy,
                  anynul,status);
          break;
        }
        if (datatype == 0x29) {
          if (nulval == (void *)0x0) {
            nulval_10 = 0;
          }
          else {
            nulval_10 = *nulval;
          }
          ffgclj(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_10,(long *)array,cdummy,anynul,
                 status);
          break;
        }
        if (datatype != 0x2a) {
          if (datatype == 1) {
            ffgcx(fptr,colnum,firstrow,firstelem,nelem,(char *)array,status);
            break;
          }
          goto switchD_0013d20f_caseD_d;
        }
        goto LAB_0013d3ea;
      }
      nelem = nelem * 2;
      firstelem = firstelem * 2 + -1;
    case 0x52:
      if (nulval == (void *)0x0) {
        nulval_01 = 0.0;
      }
      else {
        nulval_01 = *nulval;
      }
      ffgcld(fptr,colnum,firstrow,firstelem,nelem,1,1,nulval_01,(double *)array,cdummy,anynul,status
            );
    }
  }
  return *status;
}

Assistant:

int ffgcv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            int  colnum,      /* I - number of column to read (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a table column. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of true if any pixels are undefined.
*/
{
    char cdummy[2];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TBIT)
    {
      ffgcx(fptr, colnum, firstrow, firstelem, nelem, (char *) array, status);
    }
    else if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgclb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (unsigned char *) array, cdummy, anynul, status);
      else
       ffgclb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(unsigned char *)
              nulval, (unsigned char *) array, cdummy, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgclsb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (signed char *) array, cdummy, anynul, status);
      else
       ffgclsb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(signed char *)
              nulval, (signed char *) array, cdummy, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgclui(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
               (unsigned short *) array, cdummy, anynul, status);
      else
        ffgclui(fptr, colnum, firstrow, firstelem, nelem, 1, 1,
               *(unsigned short *) nulval,
               (unsigned short *) array, cdummy, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgcli(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (short *) array, cdummy, anynul, status);
      else
        ffgcli(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(short *)
              nulval, (short *) array, cdummy, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgcluk(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (unsigned int *) array, cdummy, anynul, status);
      else
        ffgcluk(fptr, colnum, firstrow, firstelem, nelem, 1, 1,
         *(unsigned int *) nulval, (unsigned int *) array, cdummy, anynul,
         status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgclk(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (int *) array, cdummy, anynul, status);
      else
        ffgclk(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(int *)
            nulval, (int *) array, cdummy, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgcluj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
               (unsigned long *) array, cdummy, anynul, status);
      else
        ffgcluj(fptr, colnum, firstrow, firstelem, nelem, 1, 1,
               *(unsigned long *) nulval, 
               (unsigned long *) array, cdummy, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgclj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (long *) array, cdummy, anynul, status);
      else
        ffgclj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(long *)
              nulval, (long *) array, cdummy, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgclujj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (ULONGLONG *) array, cdummy, anynul, status);
      else
        ffgclujj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(ULONGLONG *)
              nulval, (ULONGLONG *) array, cdummy, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgcljj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (LONGLONG *) array, cdummy, anynul, status);
      else
        ffgcljj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(LONGLONG *)
              nulval, (LONGLONG *) array, cdummy, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgcle(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0.,
              (float *) array, cdummy, anynul, status);
      else
      ffgcle(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(float *)
               nulval,(float *) array, cdummy, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0.,
              (double *) array, cdummy, anynul, status);
      else
        ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(double *)
              nulval, (double *) array, cdummy, anynul, status);
    }
    else if (datatype == TCOMPLEX)
    {
      if (nulval == 0)
        ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
           1, 1, 0., (float *) array, cdummy, anynul, status);
      else
        ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
           1, 1, *(float *) nulval, (float *) array, cdummy, anynul, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
      if (nulval == 0)
        ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2, 
         1, 1, 0., (double *) array, cdummy, anynul, status);
      else
        ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2, 
         1, 1, *(double *) nulval, (double *) array, cdummy, anynul, status);
    }

    else if (datatype == TLOGICAL)
    {
      if (nulval == 0)
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, 1, 0,
          (char *) array, cdummy, anynul, status);
      else
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, 1, *(char *) nulval,
          (char *) array, cdummy, anynul, status);
    }
    else if (datatype == TSTRING)
    {
      if (nulval == 0)
      {
        cdummy[0] = '\0';
        ffgcls(fptr, colnum, firstrow, firstelem, nelem, 1, 
             cdummy, (char **) array, cdummy, anynul, status);
      }
      else
        ffgcls(fptr, colnum, firstrow, firstelem, nelem, 1, (char *)
             nulval, (char **) array, cdummy, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}